

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::ReadBinID(BamStandardIndex *this,uint32_t *binId)

{
  uint uVar1;
  IBamIODevice *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pIVar2 = (this->m_resources).Device;
  iVar3 = (*pIVar2->_vptr_IBamIODevice[5])(pIVar2,binId,4);
  if (this->m_isBigEndian == true) {
    uVar1 = *binId;
    *binId = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  if (CONCAT44(extraout_var,iVar3) == 4) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::ReadBinID",&local_59);
  std::__cxx11::string::string((string *)&local_58,"could not read BAI bin ID",&local_5a);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadBinID(uint32_t& binId)
{
    const int64_t numBytesRead = m_resources.Device->Read((char*)&binId, sizeof(binId));
    if (m_isBigEndian) SwapEndian_32(binId);
    if (numBytesRead != sizeof(binId))
        throw BamException("BamStandardIndex::ReadBinID", "could not read BAI bin ID");
}